

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O0

int __thiscall zmq::ipc_listener_t::close(ipc_listener_t *this,int __fd)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  char *pcVar4;
  char *errstr;
  int rc;
  fd_t fd_for_event;
  endpoint_uri_pair_t *in_stack_ffffffffffffff20;
  endpoint_uri_pair_t *this_00;
  endpoint_uri_pair_t *in_stack_ffffffffffffff28;
  socket_base_t *endpoint_uri_pair_;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff68;
  int local_18;
  
  if ((this->super_stream_listener_base_t)._s == -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s != retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ipc_listener.cpp"
            ,0xbf);
    fflush(_stderr);
    zmq_abort((char *)0x228ffa);
  }
  local_18 = ::close((this->super_stream_listener_base_t)._s);
  if (local_18 != 0) {
    piVar2 = __errno_location();
    pcVar4 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ipc_listener.cpp"
            ,0xc6);
    fflush(_stderr);
    zmq_abort((char *)0x229090);
  }
  (this->super_stream_listener_base_t)._s = -1;
  if (((this->_has_file & 1U) != 0) &&
     ((this->super_stream_listener_base_t).super_own_t.options.use_fd == -1)) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_18 = unlink(pcVar4);
      if (local_18 == 0) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        local_18 = rmdir(pcVar4);
        std::__cxx11::string::clear();
      }
    }
    if (local_18 != 0) {
      endpoint_uri_pair_ = (this->super_stream_listener_base_t)._socket;
      make_unconnected_bind_endpoint_pair(in_stack_ffffffffffffff68);
      iVar1 = zmq_errno();
      socket_base_t::event_close_failed
                ((socket_base_t *)CONCAT44(iVar1,in_stack_ffffffffffffff30),
                 (endpoint_uri_pair_t *)endpoint_uri_pair_,
                 (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      endpoint_uri_pair_t::~endpoint_uri_pair_t(in_stack_ffffffffffffff20);
      return -1;
    }
  }
  this_00 = (endpoint_uri_pair_t *)&stack0xffffffffffffff40;
  make_unconnected_bind_endpoint_pair(in_stack_ffffffffffffff68);
  socket_base_t::event_closed
            ((socket_base_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,(fd_t)((ulong)this_00 >> 0x20));
  endpoint_uri_pair_t::~endpoint_uri_pair_t(this_00);
  return 0;
}

Assistant:

int zmq::ipc_listener_t::close ()
{
    zmq_assert (_s != retired_fd);
    const fd_t fd_for_event = _s;
#ifdef ZMQ_HAVE_WINDOWS
    int rc = closesocket (_s);
    wsa_assert (rc != SOCKET_ERROR);
#else
    int rc = ::close (_s);
    errno_assert (rc == 0);
#endif

    _s = retired_fd;

    if (_has_file && options.use_fd == -1) {
        if (!_tmp_socket_dirname.empty ()) {
            //  TODO review this behaviour, it is inconsistent with the use of
            //  unlink in open since 656cdb959a7482c45db979c1d08ede585d12e315;
            //  however, we must at least remove the file before removing the
            //  directory, otherwise it will always fail
            rc = ::unlink (_filename.c_str ());

            if (rc == 0) {
                rc = ::rmdir (_tmp_socket_dirname.c_str ());
                _tmp_socket_dirname.clear ();
            }
        }

        if (rc != 0) {
            _socket->event_close_failed (
              make_unconnected_bind_endpoint_pair (_endpoint), zmq_errno ());
            return -1;
        }
    }

    _socket->event_closed (make_unconnected_bind_endpoint_pair (_endpoint),
                           fd_for_event);
    return 0;
}